

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O3

void Min_SopMinimize(Min_Man_t *p)

{
  Min_Cube_t **ppMVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  Min_Man_t *p_00;
  int iVar5;
  Min_Cube_t *pMVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  Min_Cube_t *pMVar13;
  int iVar14;
  Min_Cube_t *pMVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  Min_Cube_t *pCube1;
  uint uVar20;
  Min_Cube_t *pMVar21;
  uint uVar22;
  uint uVar23;
  int Var0;
  int local_68;
  int local_64;
  Min_Man_t *local_60;
  undefined4 local_54;
  long local_50;
  Min_Cube_t **local_48;
  long local_40;
  int local_34;
  
  iVar5 = p->nCubes;
  if (iVar5 < 3) {
    return;
  }
  pMVar6 = p->pBubble;
  local_60 = p;
LAB_0044ca72:
  ppMVar1 = p->ppStore;
  pMVar6->pNext = *ppMVar1;
  *ppMVar1 = pMVar6;
  *(uint *)&pMVar6->field_0x8 = *(uint *)&pMVar6->field_0x8 & 0x3fffff;
  local_34 = iVar5;
LAB_0044ca8a:
  pMVar6 = p->pBubble;
  uVar11 = *(uint *)&pMVar6->field_0x8 >> 0x16;
  uVar12 = (ulong)uVar11;
  pMVar15 = (Min_Cube_t *)((ulong)(uVar11 * 8) + (long)p->ppStore);
  do {
    pMVar21 = pMVar15;
    pMVar15 = pMVar21->pNext;
    if (pMVar15 == (Min_Cube_t *)0x0) break;
  } while (pMVar15 != pMVar6);
  if (pMVar15 != pMVar6) {
    __assert_fail("pCube == p->pBubble",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0x6c,"void Min_SopRewrite(Min_Man_t *)");
  }
  pMVar21->pNext = pMVar6->pNext;
  pMVar6 = p->pBubble;
  pMVar15 = pMVar6->pNext;
  pCube1 = pMVar15;
  if (pMVar15 == (Min_Cube_t *)0x0) {
    uVar19 = uVar12;
    if ((int)uVar11 < p->nVars) {
      uVar19 = (ulong)(uint)p->nVars;
    }
    lVar10 = -(ulong)(uVar11 * 8);
    do {
      if (uVar19 == uVar12) {
        iVar5 = p->nCubes;
        if (((double)(local_34 - iVar5) * 100.0) / (double)local_34 <= 3.0) {
          return;
        }
        goto LAB_0044ca72;
      }
      pMVar15 = p->ppStore[uVar12 + 1];
      uVar12 = uVar12 + 1;
      lVar10 = lVar10 + -8;
    } while (pMVar15 == (Min_Cube_t *)0x0);
    pMVar21 = (Min_Cube_t *)((long)p->ppStore - lVar10);
    pCube1 = pMVar15;
  }
  do {
    pMVar6 = pCube1;
    pCube1 = pMVar6->pNext;
    if (pCube1 == (Min_Cube_t *)0x0) {
      if (p->nVars <= (int)uVar12) goto LAB_0044cd1e;
      pCube1 = (Min_Cube_t *)(p->ppStore + (long)(int)uVar12 + 1);
      goto LAB_0044cb3f;
    }
    iVar5 = Min_CubesDistTwo(pMVar15,pCube1,&local_64,&local_68);
  } while (iVar5 == 0);
  goto LAB_0044cb66;
LAB_0044cd1e:
  pMVar6 = p->pBubble;
  pMVar6->pNext = pMVar15->pNext;
  pMVar15->pNext = pMVar6;
  *(uint *)&pMVar6->field_0x8 =
       *(uint *)&pMVar6->field_0x8 & 0x3fffff | *(uint *)&pMVar15->field_0x8 & 0xffc00000;
  goto LAB_0044ca8a;
  while (iVar5 = Min_CubesDistTwo(pMVar15,pCube1,&local_64,&local_68), iVar5 == 0) {
LAB_0044cb3f:
    pMVar6 = pCube1;
    pCube1 = pMVar6->pNext;
    if (pCube1 == (Min_Cube_t *)0x0) goto LAB_0044cd1e;
  }
LAB_0044cb66:
  p_00 = local_60;
  iVar5 = local_64;
  pMVar6->pNext = pCube1->pNext;
  pMVar6 = p->pBubble;
  pMVar21->pNext = pMVar6;
  pMVar6->pNext = pMVar15->pNext;
  *(uint *)&pMVar6->field_0x8 =
       *(uint *)&pMVar6->field_0x8 & 0x3fffff | *(uint *)&pMVar15->field_0x8 & 0xffc00000;
  p->nCubes = p->nCubes + -2;
  pMVar6 = p->pBubble;
  if ((pMVar15 == pMVar6) || (pCube1 == pMVar6)) {
    __assert_fail("pCube != p->pBubble && pThis != p->pBubble",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0x9b,"void Min_SopRewrite(Min_Man_t *)");
  }
  local_50 = (long)(local_64 >> 4);
  uVar11 = pMVar15->uData[local_50];
  bVar7 = (char)local_64 * '\x02' & 0x1e;
  lVar10 = (long)(local_68 >> 4);
  bVar8 = (char)local_68 * '\x02' & 0x1e;
  uVar20 = uVar11 >> bVar7 & 3;
  uVar18 = pCube1->uData[local_50] >> bVar7 & 3;
  if (uVar20 != uVar18) {
    uVar22 = pMVar15->uData[lVar10] >> bVar8 & 3;
    uVar16 = pCube1->uData[lVar10] >> bVar8 & 3;
    if (uVar22 != uVar16) {
      if ((uVar20 == 3) && (uVar22 == 3)) {
        __assert_fail("v00 != 3 || v01 != 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0xa4,"void Min_SopRewrite(Min_Man_t *)");
      }
      if ((uVar18 == 3) && (uVar16 == 3)) {
        __assert_fail("v10 != 3 || v11 != 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0xa5,"void Min_SopRewrite(Min_Man_t *)");
      }
      p = p_00;
      pMVar21 = pCube1;
      if (((uVar18 == 3) || (uVar20 == 3 || uVar22 == 3)) || (uVar16 == 3)) {
        pMVar13 = pCube1;
        pMVar21 = pMVar15;
        uVar11 = uVar18;
        uVar23 = uVar16;
        if (((uVar20 != 3 && uVar22 != 3) &&
            (pMVar13 = pMVar15, pMVar21 = pCube1, uVar11 = uVar20, uVar23 = uVar22, uVar20 = uVar18,
            uVar22 = uVar16, uVar18 != 3)) && (uVar16 != 3)) {
          __assert_fail("v10 == 3 || v11 == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                        ,0xee,"void Min_SopRewrite(Min_Man_t *)");
        }
        uVar18 = uVar23;
        if (uVar20 != 3) {
          if (uVar22 != 3) {
            __assert_fail("v01 == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                          ,0xf7,"void Min_SopRewrite(Min_Man_t *)");
          }
          local_64 = local_68;
          local_68 = iVar5;
          uVar18 = uVar11;
          uVar22 = uVar20;
          uVar11 = uVar23;
        }
        iVar14 = local_64 >> 4;
        cVar2 = (char)local_64;
        cVar3 = (char)local_68;
        iVar5 = local_68 >> 4;
        if (uVar18 != 3) {
          if (uVar11 == 3 || uVar22 == 3) {
            __assert_fail("v01 != 3 && v10 != 3 && v11 != 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                          ,0x139,"void Min_SopRewrite(Min_Man_t *)");
          }
          pMVar13->uData[iVar14] = pMVar13->uData[iVar14] ^ 3 << (cVar2 * '\x02' & 0x1fU);
          lVar10 = 0;
          do {
            for (pMVar15 = local_60->ppStore[lVar10]; pMVar15 != (Min_Cube_t *)0x0;
                pMVar15 = pMVar15->pNext) {
              if (pMVar15 != pMVar6) {
                uVar20 = *(uint *)&pMVar15->field_0x8 >> 10 & 0xfff;
                if (uVar20 == 0) {
LAB_0044d1dd:
                  pMVar13->uData[iVar14] = pMVar13->uData[iVar14] ^ 3 << (cVar2 * '\x02' & 0x1fU);
                  goto LAB_0044d1f4;
                }
                uVar12 = 0;
                while ((pMVar13->uData[uVar12] & ~pMVar15->uData[uVar12]) == 0) {
                  uVar12 = uVar12 + 1;
                  if (uVar20 == uVar12) goto LAB_0044d1dd;
                }
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != (ulong)(*(uint *)&pMVar13->field_0x8 >> 0x16) + 1);
          pMVar13->uData[iVar14] = pMVar13->uData[iVar14] ^ 3 << (cVar2 * '\x02' & 0x1fU);
          pMVar21->uData[iVar14] = pMVar21->uData[iVar14] ^ uVar11 << (cVar2 * '\x02' & 0x1fU);
          *(int *)&pMVar21->field_0x8 = *(int *)&pMVar21->field_0x8 + 0x400000;
          pMVar13->uData[iVar5] = pMVar13->uData[iVar5] ^ (uVar18 ^ 3) << (cVar3 * '\x02' & 0x1fU);
          *(int *)&pMVar13->field_0x8 = *(int *)&pMVar13->field_0x8 + -0x400000;
          Min_SopAddCube(local_60,pMVar21);
          Min_SopAddCube(p_00,pMVar13);
          goto LAB_0044ca8a;
        }
        if (uVar11 == 3 || uVar22 == 3) {
          __assert_fail("v01 != 3 && v10 != 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                        ,0x100,"void Min_SopRewrite(Min_Man_t *)");
        }
        pMVar21->uData[iVar14] = pMVar21->uData[iVar14] ^ uVar11 << (cVar2 * '\x02' & 0x1fU);
        pMVar21->uData[iVar5] = pMVar21->uData[iVar5] ^ 3 << (cVar3 * '\x02' & 0x1fU);
        uVar20 = *(uint *)&pMVar21->field_0x8 & 0xffc00000;
        *(uint *)&pMVar21->field_0x8 = uVar20 + (*(uint *)&pMVar21->field_0x8 & 0x3fffff) + 0x400000
        ;
        uVar12 = 0;
        do {
          pMVar6 = local_60->ppStore[uVar12];
          if (pMVar6 != (Min_Cube_t *)0x0) {
            do {
              if (pMVar6 != local_60->pBubble) {
                uVar18 = *(uint *)&pMVar6->field_0x8 >> 10 & 0xfff;
                if (uVar18 == 0) {
LAB_0044d0e8:
                  bVar4 = false;
                  goto LAB_0044d0ea;
                }
                uVar19 = 0;
                while ((pMVar21->uData[uVar19] & ~pMVar6->uData[uVar19]) == 0) {
                  uVar19 = uVar19 + 1;
                  if (uVar18 == uVar19) goto LAB_0044d0e8;
                }
              }
              pMVar6 = pMVar6->pNext;
            } while (pMVar6 != (Min_Cube_t *)0x0);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != (uVar20 + 0x400000 >> 0x16) + 1);
        bVar4 = true;
LAB_0044d0ea:
        pMVar21->uData[iVar14] = pMVar21->uData[iVar14] ^ uVar11 << (cVar2 * '\x02' & 0x1fU);
        pMVar21->uData[iVar5] = pMVar21->uData[iVar5] ^ 3 << (cVar3 * '\x02' & 0x1fU);
        *(int *)&pMVar21->field_0x8 = *(int *)&pMVar21->field_0x8 + -0x400000;
        if (bVar4) {
          pMVar21->uData[iVar14] = pMVar21->uData[iVar14] ^ uVar11 << (cVar2 * '\x02' & 0x1fU);
          *(int *)&pMVar21->field_0x8 = *(int *)&pMVar21->field_0x8 + 0x400000;
          iVar5 = local_60->nCubes;
          Min_SopAddCube(local_60,pMVar21);
          iVar14 = p_00->nCubes;
          if (iVar5 < iVar14) {
            uVar20 = *(uint *)&pMVar21->field_0x8 >> 0x16;
            if (pMVar21 != p_00->ppStore[uVar20]) {
              __assert_fail("pCube == p->ppStore[pCube->nLits]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                            ,0x125,"void Min_SopRewrite(Min_Man_t *)");
            }
            p_00->ppStore[uVar20] = pMVar21->pNext;
            p_00->nCubes = iVar14 + -1;
            pMVar21->uData[local_64 >> 4] =
                 pMVar21->uData[local_64 >> 4] ^ uVar11 << ((char)local_64 * '\x02' & 0x1fU);
            *(int *)&pMVar21->field_0x8 = *(int *)&pMVar21->field_0x8 + -0x400000;
            pMVar13->uData[local_68 >> 4] =
                 pMVar13->uData[local_68 >> 4] ^ uVar22 << ((char)local_68 * '\x02' & 0x1fU);
            *(int *)&pMVar13->field_0x8 = *(int *)&pMVar13->field_0x8 + 0x400000;
            Min_SopAddCube(p_00,pMVar21);
          }
          Min_SopAddCube(p_00,pMVar13);
          goto LAB_0044ca8a;
        }
LAB_0044d1f4:
        Extra_MmFixedEntryRecycle(local_60->pMemMan,(char *)pMVar13);
        pMVar21->uData[local_68 >> 4] =
             pMVar21->uData[local_68 >> 4] ^ (uVar22 ^ 3) << ((char)local_68 * '\x02' & 0x1fU);
        *(int *)&pMVar21->field_0x8 = *(int *)&pMVar21->field_0x8 + -0x400000;
      }
      else {
        if ((uVar18 ^ uVar20) != 3) {
          __assert_fail("v00 == (v10 ^ 3)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                        ,0xb2,"void Min_SopRewrite(Min_Man_t *)");
        }
        local_40 = lVar10;
        if ((uVar16 ^ uVar22) != 3) {
          __assert_fail("v01 == (v11 ^ 3)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                        ,0xb3,"void Min_SopRewrite(Min_Man_t *)");
        }
        pMVar15->uData[local_50] = 3 << bVar7 ^ uVar11;
        local_48 = local_60->ppStore;
        lVar9 = (ulong)(*(uint *)&pMVar15->field_0x8 >> 0x16) + 1;
        lVar17 = 0;
        do {
          for (pMVar13 = local_48[lVar17]; pMVar13 != (Min_Cube_t *)0x0; pMVar13 = pMVar13->pNext) {
            if (pMVar13 != pMVar6) {
              bVar4 = true;
              uVar18 = *(uint *)&pMVar13->field_0x8 >> 10 & 0xfff;
              if (uVar18 == 0) {
LAB_0044cd76:
                local_54 = 0;
                goto LAB_0044cd83;
              }
              uVar12 = 0;
              while ((pMVar15->uData[uVar12] & ~pMVar13->uData[uVar12]) == 0) {
                uVar12 = uVar12 + 1;
                if (uVar18 == uVar12) goto LAB_0044cd76;
              }
            }
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != lVar9);
        local_54 = (undefined4)CONCAT71((int7)((ulong)lVar9 >> 8),1);
        bVar4 = false;
LAB_0044cd83:
        pMVar15->uData[local_50] = uVar11;
        uVar11 = pMVar15->uData[lVar10];
        pMVar15->uData[lVar10] = 3 << bVar8 ^ uVar11;
        lVar9 = 0;
        do {
          for (pMVar13 = local_48[lVar9]; pMVar13 != (Min_Cube_t *)0x0; pMVar13 = pMVar13->pNext) {
            if (pMVar13 != pMVar6) {
              uVar18 = *(uint *)&pMVar13->field_0x8 >> 10 & 0xfff;
              if (uVar18 == 0) {
LAB_0044ce2a:
                pMVar15->uData[lVar10] = uVar11;
                if (bVar4) {
                  Extra_MmFixedEntryRecycle(local_60->pMemMan,(char *)pCube1);
                  p = local_60;
                  pMVar15->uData[local_50] = pMVar15->uData[local_50] ^ (uVar20 ^ 3) << bVar7;
                  pMVar15->uData[lVar10] = pMVar15->uData[lVar10] ^ (uVar22 ^ 3) << bVar8;
                  *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x800000;
                  Min_SopAddCube(local_60,pMVar15);
                  goto LAB_0044ca8a;
                }
                pMVar15->uData[lVar10] = uVar11 ^ (uVar22 ^ 3) << bVar8;
                *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x400000;
                Min_SopAddCube(local_60,pMVar15);
                pCube1->uData[local_50] = pCube1->uData[local_50] ^ uVar20 << bVar7;
                *(int *)&pCube1->field_0x8 = *(int *)&pCube1->field_0x8 + -0x400000;
                goto LAB_0044d229;
              }
              uVar12 = 0;
              while ((pMVar15->uData[uVar12] & ~pMVar13->uData[uVar12]) == 0) {
                uVar12 = uVar12 + 1;
                if (uVar18 == uVar12) goto LAB_0044ce2a;
              }
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != (ulong)(*(uint *)&pMVar15->field_0x8 >> 0x16) + 1);
        pMVar15->uData[lVar10] = uVar11;
        if ((char)local_54 == '\0') {
          pMVar15->uData[local_50] = pMVar15->uData[local_50] ^ (uVar20 ^ 3) << bVar7;
          *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x400000;
          Min_SopAddCube(local_60,pMVar15);
          pCube1->uData[lVar10] = pCube1->uData[lVar10] ^ uVar22 << bVar8;
          *(int *)&pCube1->field_0x8 = *(int *)&pCube1->field_0x8 + -0x400000;
        }
        else {
          Min_SopAddCube(local_60,pMVar15);
        }
      }
LAB_0044d229:
      Min_SopAddCube(p_00,pMVar21);
      goto LAB_0044ca8a;
    }
  }
  __assert_fail("v00 != v10 && v01 != v11",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                ,0xa3,"void Min_SopRewrite(Min_Man_t *)");
}

Assistant:

void Min_SopMinimize( Min_Man_t * p )
{
    int nCubesInit, nCubesOld, nIter;
    if ( p->nCubes < 3 )
        return;
    nIter = 0;
    nCubesInit = p->nCubes;
    do {
        nCubesOld = p->nCubes;
        Min_SopRewrite( p );
        nIter++;
//    printf( "%d:%d->%d ", nIter, nCubesInit, p->nCubes );
    }
    while ( 100.0*(nCubesOld - p->nCubes)/nCubesOld > 3.0 );
//    printf( "\n" );

}